

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.c
# Opt level: O0

axbStatus_t axbMemBackendSetName(axbMemBackend_s *ops,char *name)

{
  size_t sVar1;
  char *pcVar2;
  ulong local_28;
  size_t i;
  size_t len;
  char *name_local;
  axbMemBackend_s *ops_local;
  
  sVar1 = strlen(name);
  if (ops->name_capacity < sVar1) {
    free(ops->name);
    ops->name_capacity = sVar1 + 2;
    pcVar2 = (char *)malloc(ops->name_capacity);
    ops->name = pcVar2;
  }
  for (local_28 = 0; local_28 <= sVar1; local_28 = local_28 + 1) {
    ops->name[local_28] = name[local_28];
  }
  return 0;
}

Assistant:

axbStatus_t axbMemBackendSetName(struct axbMemBackend_s *ops, const char *name)
{
  size_t len = strlen(name);
  if (len > ops->name_capacity) {
    free(ops->name);
    ops->name_capacity = len + 2;
    ops->name = malloc(ops->name_capacity);
  }
  for (size_t i=0; i<=len; ++i) ops->name[i] = name[i];

  return 0;
}